

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O3

void __thiscall ClipperLib::Clipper::ProcessHorizontal(Clipper *this,TEdge *horzEdge)

{
  double dVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  bool bVar7;
  clipperException *this_00;
  TEdge *pTVar8;
  long lVar9;
  TEdge **ppTVar10;
  TEdge *pTVar11;
  TEdge *pTVar12;
  TEdge *pTVar13;
  TEdge *pTVar14;
  IntersectProtects protects;
  TEdge **ppTVar15;
  TEdge *pTVar16;
  IntPoint local_58;
  long local_48;
  long local_40;
  TEdge *local_38;
  
  local_48 = horzEdge->xcurr;
  lVar4 = horzEdge->xtop;
  if (horzEdge->nextInLML == (TEdge *)0x0) {
    pTVar16 = horzEdge->next;
    if ((((pTVar16 == (TEdge *)0x0) || (pTVar16->ytop != horzEdge->ytop)) ||
        (pTVar16->nextInLML != (TEdge *)0x0)) || (pTVar16->xtop != lVar4)) {
      pTVar16 = horzEdge->prev;
    }
  }
  else {
    pTVar16 = (TEdge *)0x0;
  }
  local_38 = horzEdge;
  if ((&horzEdge->nextInAEL)[lVar4 <= local_48] == (TEdge *)0x0) {
LAB_00688bba:
    if (horzEdge->nextInLML == (TEdge *)0x0) {
      if (-1 < horzEdge->outIdx) {
        uVar2 = horzEdge->ycurr;
        uVar3 = horzEdge->xtop;
        local_58.Y._0_4_ = (int)uVar2;
        local_58.X = uVar3;
        local_58.Y._4_4_ = (int)((ulong)uVar2 >> 0x20);
        IntersectEdges(this,horzEdge,pTVar16,&local_58,ipBoth);
      }
      if (pTVar16 == (TEdge *)0x0) {
        __assert_fail("eMaxPair",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/contrib/clipper/clipper.cpp"
                      ,0x988,"void ClipperLib::Clipper::ProcessHorizontal(TEdge *)");
      }
      if (-1 < pTVar16->outIdx) {
        this_00 = (clipperException *)__cxa_allocate_exception(0x28);
        clipperException::clipperException(this_00,"ProcessHorizontal error");
LAB_00688dc8:
        __cxa_throw(this_00,&clipperException::typeinfo,clipperException::~clipperException);
      }
      pTVar14 = pTVar16->nextInAEL;
      pTVar12 = pTVar16->prevInAEL;
      pTVar11 = this->m_ActiveEdges;
      ppTVar15 = &this->m_ActiveEdges;
      if (pTVar11 == pTVar16 || (pTVar12 != (TEdge *)0x0 || pTVar14 != (TEdge *)0x0)) {
        ppTVar10 = &pTVar12->nextInAEL;
        if (pTVar12 == (TEdge *)0x0) {
          ppTVar10 = ppTVar15;
        }
        *ppTVar10 = pTVar14;
        if (pTVar14 != (TEdge *)0x0) {
          pTVar14->prevInAEL = pTVar12;
        }
        pTVar16->nextInAEL = (TEdge *)0x0;
        pTVar16->prevInAEL = (TEdge *)0x0;
        pTVar11 = *ppTVar15;
      }
      pTVar16 = horzEdge->nextInAEL;
      pTVar14 = horzEdge->prevInAEL;
      if (((pTVar14 != (TEdge *)0x0) || (pTVar16 != (TEdge *)0x0)) || (pTVar11 == horzEdge)) {
        if (pTVar14 != (TEdge *)0x0) {
          ppTVar15 = &pTVar14->nextInAEL;
        }
        *ppTVar15 = pTVar16;
        if (pTVar16 != (TEdge *)0x0) {
          pTVar16->prevInAEL = pTVar14;
        }
        horzEdge->nextInAEL = (TEdge *)0x0;
        horzEdge->prevInAEL = (TEdge *)0x0;
      }
    }
    else {
LAB_00688bc1:
      if (-1 < horzEdge->outIdx) {
        local_58.X = horzEdge->xtop;
        local_58.Y = horzEdge->ytop;
        AddOutPt(this,horzEdge,&local_58);
      }
      UpdateEdgeIntoAEL(this,&local_38);
    }
    return;
  }
  local_40 = (ulong)(lVar4 <= local_48) * 8 + 0x70;
  pTVar14 = (&horzEdge->nextInAEL)[lVar4 <= local_48];
LAB_00688961:
  pTVar12 = *(TEdge **)((long)&pTVar14->xbot + local_40);
  if (pTVar16 == (TEdge *)0x0) {
    lVar5 = pTVar14->xcurr;
    if (local_48 < lVar4) {
      if (lVar5 <= lVar4) {
LAB_00688a98:
        if (lVar5 != horzEdge->xtop) goto LAB_00688973;
        if (horzEdge->nextInLML == (TEdge *)0x0) {
          __assert_fail("horzEdge->nextInLML",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/contrib/clipper/clipper.cpp"
                        ,0x947,"void ClipperLib::Clipper::ProcessHorizontal(TEdge *)");
        }
        bVar7 = SlopesEqual(pTVar14,horzEdge->nextInLML,
                            (bool)(this->_vptr_Clipper[-3] + 0x10)
                                  [(long)&(this->m_PolyOuts).
                                          super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>
                                  ]);
        if (bVar7) {
          if ((-1 < horzEdge->outIdx) && (-1 < pTVar14->outIdx)) {
            AddJoin(this,horzEdge->nextInLML,pTVar14,horzEdge->outIdx,-1);
          }
          goto LAB_00688bba;
        }
        dVar1 = horzEdge->nextInLML->dx;
        if (pTVar14->dx <= dVar1 && dVar1 != pTVar14->dx) goto LAB_00688bc1;
        goto LAB_00688973;
      }
    }
    else if (lVar4 <= lVar5) goto LAB_00688a98;
    if (this->m_SortedEdges == (TEdge *)0x0) goto LAB_00688bae;
    goto LAB_00688bba;
  }
LAB_00688973:
  if (pTVar14 != pTVar16) {
    pTVar11 = horzEdge;
    pTVar13 = horzEdge;
    if (((1e-20 <= ABS(pTVar14->dx + 1e+40)) ||
        ((pTVar14->prev->nextInLML != pTVar14 && (pTVar14->next->nextInLML != pTVar14)))) ||
       (local_58.X = pTVar14->xcurr, pTVar14->xtop < local_58.X)) {
      if (local_48 < lVar4) {
        local_58.X = pTVar14->xcurr;
        local_58.Y = horzEdge->ycurr;
        protects = ipLeft;
        for (pTVar8 = this->m_SortedEdges; pTVar11 = pTVar14, pTVar8 != (TEdge *)0x0;
            pTVar8 = pTVar8->nextInSEL) {
          lVar5 = pTVar8->xcurr;
          lVar6 = pTVar8->xtop;
          lVar9 = lVar6;
          if (lVar6 < lVar5) {
            lVar9 = lVar5;
            lVar5 = lVar6;
          }
          if ((lVar5 <= local_58.X) && (local_58.X <= lVar9)) goto LAB_00688b33;
        }
      }
      else {
        local_58.X = pTVar14->xcurr;
        local_58.Y = horzEdge->ycurr;
        protects = ipRight;
        for (pTVar8 = this->m_SortedEdges; pTVar13 = pTVar14, pTVar8 != (TEdge *)0x0;
            pTVar8 = pTVar8->nextInSEL) {
          lVar5 = pTVar8->xcurr;
          lVar6 = pTVar8->xtop;
          lVar9 = lVar6;
          if (lVar6 < lVar5) {
            lVar9 = lVar5;
            lVar5 = lVar6;
          }
          if ((lVar5 <= local_58.X) && (local_58.X <= lVar9)) goto LAB_00688b89;
        }
      }
    }
    else if (local_48 < lVar4) {
      local_58.Y = horzEdge->ycurr;
      protects = ipLeft;
      for (pTVar8 = this->m_SortedEdges; pTVar11 = pTVar14, pTVar8 != (TEdge *)0x0;
          pTVar8 = pTVar8->nextInSEL) {
        lVar5 = pTVar8->xcurr;
        lVar6 = pTVar8->xtop;
        lVar9 = lVar6;
        if (lVar6 < lVar5) {
          lVar9 = lVar5;
          lVar5 = lVar6;
        }
        if ((lVar5 <= local_58.X) && (local_58.X <= lVar9)) goto LAB_00688b33;
      }
    }
    else {
      local_58.Y = horzEdge->ycurr;
      protects = ipRight;
      for (pTVar8 = this->m_SortedEdges; pTVar13 = pTVar14, pTVar8 != (TEdge *)0x0;
          pTVar8 = pTVar8->nextInSEL) {
        lVar5 = pTVar8->xcurr;
        lVar6 = pTVar8->xtop;
        lVar9 = lVar6;
        if (lVar6 < lVar5) {
          lVar9 = lVar5;
          lVar5 = lVar6;
        }
        if ((lVar5 <= local_58.X) && (local_58.X <= lVar9)) goto LAB_00688b89;
      }
    }
    goto LAB_00688b98;
  }
  if (local_48 < lVar4) {
    local_58.Y = horzEdge->ycurr;
    local_58.X = pTVar14->xcurr;
    pTVar12 = pTVar14;
    pTVar14 = horzEdge;
  }
  else {
    local_58.Y = horzEdge->ycurr;
    local_58.X = pTVar14->xcurr;
    pTVar12 = horzEdge;
  }
  IntersectEdges(this,pTVar14,pTVar12,&local_58,ipNone);
  if (pTVar16->outIdx < 0) {
    return;
  }
  this_00 = (clipperException *)__cxa_allocate_exception(0x28);
  clipperException::clipperException(this_00,"ProcessHorizontal error");
  goto LAB_00688dc8;
LAB_00688b33:
  protects = ipBoth;
  pTVar11 = pTVar14;
  goto LAB_00688b98;
LAB_00688b89:
  protects = ipBoth;
  pTVar13 = pTVar14;
LAB_00688b98:
  IntersectEdges(this,pTVar13,pTVar11,&local_58,protects);
  SwapPositionsInAEL(this,horzEdge,pTVar14);
LAB_00688bae:
  pTVar14 = pTVar12;
  if (pTVar12 == (TEdge *)0x0) goto LAB_00688bba;
  goto LAB_00688961;
}

Assistant:

void Clipper::ProcessHorizontal(TEdge *horzEdge)
{
  Direction dir;
  long64 horzLeft, horzRight;

  if( horzEdge->xcurr < horzEdge->xtop )
  {
    horzLeft = horzEdge->xcurr;
    horzRight = horzEdge->xtop;
    dir = dLeftToRight;
  } else
  {
    horzLeft = horzEdge->xtop;
    horzRight = horzEdge->xcurr;
    dir = dRightToLeft;
  }

  TEdge* eMaxPair;
  if( horzEdge->nextInLML ) eMaxPair = 0;
  else eMaxPair = GetMaximaPair(horzEdge);

  TEdge* e = GetNextInAEL( horzEdge , dir );
  while( e )
  {
    TEdge* eNext = GetNextInAEL( e, dir );

    if (eMaxPair ||
      ((dir == dLeftToRight) && (e->xcurr <= horzRight)) ||
      ((dir == dRightToLeft) && (e->xcurr >= horzLeft)))
    {
      //ok, so far it looks like we're still in range of the horizontal edge
      if ( e->xcurr == horzEdge->xtop && !eMaxPair )
      {
        assert(horzEdge->nextInLML);
        if (SlopesEqual(*e, *horzEdge->nextInLML, m_UseFullRange))
        {
          //if output polygons share an edge, they'll need joining later ...
          if (horzEdge->outIdx >= 0 && e->outIdx >= 0)
            AddJoin(horzEdge->nextInLML, e, horzEdge->outIdx);
          break; //we've reached the end of the horizontal line
        }
        else if (e->dx < horzEdge->nextInLML->dx)
        //we really have got to the end of the intermediate horz edge so quit.
        //nb: More -ve slopes follow more +ve slopes ABOVE the horizontal.
          break;
      }

      if( e == eMaxPair )
      {
        //horzEdge is evidently a maxima horizontal and we've arrived at its end.
        if (dir == dLeftToRight)
          IntersectEdges(horzEdge, e, IntPoint(e->xcurr, horzEdge->ycurr), ipNone);
        else
          IntersectEdges(e, horzEdge, IntPoint(e->xcurr, horzEdge->ycurr), ipNone);
        if (eMaxPair->outIdx >= 0) throw clipperException("ProcessHorizontal error");
        return;
      }
      else if( NEAR_EQUAL(e->dx, HORIZONTAL) &&  !IsMinima(e) && !(e->xcurr > e->xtop) )
      {
        //An overlapping horizontal edge. Overlapping horizontal edges are
        //processed as if layered with the current horizontal edge (horizEdge)
        //being infinitesimally lower that the next (e). Therfore, we
        //intersect with e only if e.xcurr is within the bounds of horzEdge ...
        if( dir == dLeftToRight )
          IntersectEdges( horzEdge , e, IntPoint(e->xcurr, horzEdge->ycurr),
            (IsTopHorz( e->xcurr ))? ipLeft : ipBoth );
        else
          IntersectEdges( e, horzEdge, IntPoint(e->xcurr, horzEdge->ycurr),
            (IsTopHorz( e->xcurr ))? ipRight : ipBoth );
      }
      else if( dir == dLeftToRight )
      {
        IntersectEdges( horzEdge, e, IntPoint(e->xcurr, horzEdge->ycurr),
          (IsTopHorz( e->xcurr ))? ipLeft : ipBoth );
      }
      else
      {
        IntersectEdges( e, horzEdge, IntPoint(e->xcurr, horzEdge->ycurr),
          (IsTopHorz( e->xcurr ))? ipRight : ipBoth );
      }
      SwapPositionsInAEL( horzEdge, e );
    }
    else if( (dir == dLeftToRight && e->xcurr > horzRight  && m_SortedEdges) ||
     (dir == dRightToLeft && e->xcurr < horzLeft && m_SortedEdges) ) break;
    e = eNext;
  } //end while

  if( horzEdge->nextInLML )
  {
    if( horzEdge->outIdx >= 0 )
      AddOutPt( horzEdge, IntPoint(horzEdge->xtop, horzEdge->ytop));
    UpdateEdgeIntoAEL( horzEdge );
  }
  else
  {
    if ( horzEdge->outIdx >= 0 )
      IntersectEdges( horzEdge, eMaxPair,
      IntPoint(horzEdge->xtop, horzEdge->ycurr), ipBoth);
    assert(eMaxPair);
    if (eMaxPair->outIdx >= 0) throw clipperException("ProcessHorizontal error");
    DeleteFromAEL(eMaxPair);
    DeleteFromAEL(horzEdge);
  }
}